

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuValuesInParamsGenerator<double>::iuValuesInParamsGenerator<double,1ul>
          (iuValuesInParamsGenerator<double> *this,double (*values) [1])

{
  (this->super_iuIParamGenerator<std::tuple<bool,_int,_int>_>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_0039c310;
  (this->m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_it)._M_current = (double *)0x0;
  std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
            ((vector<double,std::allocator<double>> *)&this->m_values,0,values,values + 1);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }